

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::pair_range_nested
          (basic_substring<const_char> *this,CC open,CC close)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  undefined7 in_register_00000011;
  long lVar4;
  size_t start;
  ro_substr chars;
  ro_substr chars_00;
  basic_substring<const_char> bVar5;
  char both [3];
  CC local_53;
  CC local_52;
  undefined1 local_51;
  ulong local_50;
  undefined4 local_44;
  basic_substring<const_char> local_40;
  
  local_50 = first_of(this,open,0);
  if (local_50 != 0xffffffffffffffff) {
    start = local_50 + 1;
    local_51 = 0;
    chars.len = 2;
    chars.str = &local_53;
    local_53 = open;
    local_52 = close;
    sVar3 = first_of(this,chars,start);
    if (sVar3 == 0xffffffffffffffff) {
      local_40.len = 0;
      local_40.str = (char *)0x0;
      goto LAB_001ee7d6;
    }
    local_44 = (undefined4)CONCAT71(in_register_00000011,close);
    lVar4 = 0;
    do {
      if (this->str[sVar3] == open) {
        lVar4 = lVar4 + 1;
LAB_001ee75f:
        start = sVar3 + 1;
      }
      else if (this->str[sVar3] == (char)local_44) {
        if (lVar4 != 0) {
          lVar4 = lVar4 + -1;
          goto LAB_001ee75f;
        }
        if (this->len < local_50) {
          if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            pcVar1 = (code *)swi(3);
            bVar5 = (basic_substring<const_char>)(*pcVar1)();
            return bVar5;
          }
          handle_error(0x1fbf87,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        sVar3 = sVar3 + 1;
        if (sVar3 == 0xffffffffffffffff) {
          sVar3 = this->len;
        }
        if (sVar3 < local_50) {
          if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            pcVar1 = (code *)swi(3);
            bVar5 = (basic_substring<const_char>)(*pcVar1)();
            return bVar5;
          }
          handle_error(0x1fbf87,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (this->len < sVar3) {
          if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            pcVar1 = (code *)swi(3);
            bVar5 = (basic_substring<const_char>)(*pcVar1)();
            return bVar5;
          }
          handle_error(0x1fbf87,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring(&local_40,this->str + local_50,sVar3 - local_50);
        goto LAB_001ee7d6;
      }
      chars_00.len = 2;
      chars_00.str = &local_53;
      sVar3 = first_of(this,chars_00,start);
    } while (sVar3 != 0xffffffffffffffff);
  }
  local_40.str = (char *)0x0;
  local_40.len = 0;
LAB_001ee7d6:
  bVar5.len = local_40.len;
  bVar5.str = local_40.str;
  return bVar5;
}

Assistant:

basic_substring pair_range_nested(CC open, CC close) const
    {
        size_t b = find(open);
        if(b == npos) return basic_substring();
        size_t e, curr = b+1, count = 0;
        const char both[] = {open, close, '\0'};
        while((e = first_of(both, curr)) != npos)
        {
            if(str[e] == open)
            {
                ++count;
                curr = e+1;
            }
            else if(str[e] == close)
            {
                if(count == 0) return range(b, e+1);
                --count;
                curr = e+1;
            }
        }
        return basic_substring();
    }